

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

char * transform_schema2json(lys_module *module,char *expr)

{
  ly_ctx *ctx;
  uint16_t *puVar1;
  size_t sVar2;
  lyxp_expr *expr_00;
  lys_module *plVar3;
  ushort **ppuVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  size_t local_58;
  char *local_40;
  long local_38;
  
  ctx = module->ctx;
  sVar2 = strlen(expr);
  local_58 = sVar2 + 1;
  local_40 = (char *)malloc(local_58);
  if (local_40 == (char *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","transform_schema2json");
  }
  else {
    expr_00 = lyxp_parse_expr(ctx,expr);
    if (expr_00 != (lyxp_expr *)0x0) {
      uVar7 = 0;
      local_38 = 0;
      do {
        if (expr_00->used <= uVar7) {
          local_40[local_38] = '\0';
          lyxp_expr_free(expr_00);
          pcVar9 = lydict_insert_zc(module->ctx,local_40);
          return pcVar9;
        }
        pcVar9 = expr_00->expr + expr_00->expr_pos[uVar7];
        if ((uVar7 != 0) &&
           (uVar5 = (int)uVar7 - 1,
           pcVar6 = expr_00->expr + (ulong)expr_00->tok_len[uVar5] + (ulong)expr_00->expr_pos[uVar5]
           , pcVar6 != pcVar9)) {
          strncpy(local_40 + local_38,pcVar6,(long)pcVar9 - (long)pcVar6);
          local_38 = local_38 + ((long)pcVar9 - (long)pcVar6);
        }
        uVar5 = (uint)expr_00->tok_len[uVar7];
        if (expr_00->tokens[uVar7] == LYXP_TOKEN_LITERAL) {
          pcVar6 = strnchr(pcVar9,0x3a,uVar5);
          if (pcVar6 == (char *)0x0) goto LAB_001099aa;
          ppuVar4 = __ctype_b_loc();
          lVar8 = 0;
          while ((((*ppuVar4)[pcVar6[lVar8 + -1]] & 8) != 0 ||
                 ((uVar5 = (byte)pcVar6[lVar8 + -1] - 0x2d, uVar5 < 0x33 &&
                  ((0x4000000000003U >> ((ulong)uVar5 & 0x3f) & 1) != 0))))) {
            lVar8 = lVar8 + -1;
          }
          plVar3 = lyp_get_module(module,pcVar6 + lVar8,(int)-lVar8,(char *)0x0,0,0);
          if (plVar3 == (lys_module *)0x0) {
            strncpy(local_40 + local_38,expr_00->expr + expr_00->expr_pos[uVar7],
                    (ulong)expr_00->tok_len[uVar7]);
            local_38 = local_38 + (ulong)expr_00->tok_len[uVar7];
          }
          else {
            sVar2 = strlen(plVar3->name);
            local_58 = local_58 + lVar8 + sVar2;
            local_40 = (char *)ly_realloc(local_40,local_58);
            if (local_40 == (char *)0x0) goto LAB_00109b8d;
            strncpy(local_40 + local_38,pcVar9,(size_t)(pcVar6 + (lVar8 - (long)pcVar9)));
            strcpy(local_40 + (long)(pcVar6 + lVar8 + (local_38 - (long)pcVar9)),plVar3->name);
            sVar2 = strlen(plVar3->name);
            puVar1 = expr_00->tok_len;
            strncpy(local_40 + (long)(pcVar6 + lVar8 + (local_38 - (long)pcVar9)) + sVar2,pcVar6,
                    (ulong)puVar1[uVar7] - (-lVar8 + (long)(pcVar6 + (lVar8 - (long)pcVar9))));
            local_38 = local_38 + sVar2 + lVar8 + (ulong)puVar1[uVar7];
          }
        }
        else if ((expr_00->tokens[uVar7] == LYXP_TOKEN_NAMETEST) &&
                (pcVar6 = strnchr(pcVar9,0x3a,uVar5), pcVar6 != (char *)0x0)) {
          lVar8 = (long)pcVar6 - (long)pcVar9;
          plVar3 = lyp_get_module(module,pcVar9,(int)lVar8,(char *)0x0,0,0);
          if (plVar3 == (lys_module *)0x0) {
            ly_vlog(ctx,LYE_INMOD_LEN,LY_VLOG_NONE,(void *)0x0,lVar8,pcVar9);
            break;
          }
          sVar2 = strlen(plVar3->name);
          local_58 = local_58 + (sVar2 - lVar8);
          local_40 = (char *)ly_realloc(local_40,local_58);
          if (local_40 == (char *)0x0) {
LAB_00109b8d:
            local_40 = (char *)0x0;
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","transform_schema2json");
            break;
          }
          strcpy(local_40 + local_38,plVar3->name);
          sVar2 = strlen(plVar3->name);
          puVar1 = expr_00->tok_len;
          strncpy(local_40 + sVar2 + local_38,pcVar6,(ulong)puVar1[uVar7] - lVar8);
          local_38 = ((sVar2 + local_38) - lVar8) + (ulong)puVar1[uVar7];
        }
        else {
LAB_001099aa:
          strncpy(local_40 + local_38,expr_00->expr + expr_00->expr_pos[uVar7],(ulong)uVar5);
          local_38 = local_38 + (ulong)expr_00->tok_len[uVar7];
        }
        uVar7 = uVar7 + 1;
      } while( true );
    }
    free(local_40);
    lyxp_expr_free(expr_00);
  }
  return (char *)0x0;
}

Assistant:

const char *
transform_schema2json(const struct lys_module *module, const char *expr)
{
    const char *end, *cur_expr, *ptr;
    char *out;
    uint16_t i;
    size_t out_size, out_used, pref_len;
    const struct lys_module *mod;
    struct ly_ctx *ctx = module->ctx;
    struct lyxp_expr *exp = NULL;

    out_size = strlen(expr) + 1;
    out = malloc(out_size);
    LY_CHECK_ERR_RETURN(!out, LOGMEM(ctx), NULL);
    out_used = 0;

    exp = lyxp_parse_expr(ctx, expr);
    LY_CHECK_ERR_GOTO(!exp, , error);

    for (i = 0; i < exp->used; ++i) {
        cur_expr = &exp->expr[exp->expr_pos[i]];

        /* copy WS */
        if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
            strncpy(&out[out_used], end, cur_expr - end);
            out_used += cur_expr - end;
        }

        if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            /* get the module */
            pref_len = end - cur_expr;
            mod = lyp_get_module(module, cur_expr, pref_len, NULL, 0, 0);
            if (!mod) {
                LOGVAL(ctx, LYE_INMOD_LEN, LY_VLOG_NONE, NULL, pref_len, cur_expr);
                goto error;
            }

            /* adjust out size (it can even decrease in some strange cases) */
            out_size += strlen(mod->name) - pref_len;
            out = ly_realloc(out, out_size);
            LY_CHECK_ERR_GOTO(!out, LOGMEM(ctx), error);

            /* copy the model name */
            strcpy(&out[out_used], mod->name);
            out_used += strlen(mod->name);

            /* copy the rest */
            strncpy(&out[out_used], end, exp->tok_len[i] - pref_len);
            out_used += exp->tok_len[i] - pref_len;
        } else if ((exp->tokens[i] == LYXP_TOKEN_LITERAL) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            ptr = end;
            while (isalnum(ptr[-1]) || (ptr[-1] == '_') || (ptr[-1] == '-') || (ptr[-1] == '.')) {
                --ptr;
            }

            /* get the module */
            pref_len = end - ptr;
            mod = lyp_get_module(module, ptr, pref_len, NULL, 0, 0);
            if (mod) {
                /* adjust out size (it can even decrease in some strange cases) */
                out_size += strlen(mod->name) - pref_len;
                out = ly_realloc(out, out_size);
                LY_CHECK_ERR_GOTO(!out, LOGMEM(ctx), error);

                /* copy any beginning */
                strncpy(&out[out_used], cur_expr, ptr - cur_expr);
                out_used += ptr - cur_expr;

                /* copy the model name */
                strcpy(&out[out_used], mod->name);
                out_used += strlen(mod->name);

                /* copy the rest */
                strncpy(&out[out_used], end, (exp->tok_len[i] - pref_len) - (ptr - cur_expr));
                out_used += (exp->tok_len[i] - pref_len) - (ptr - cur_expr);
            } else {
                strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                out_used += exp->tok_len[i];
            }
        } else {
            strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
            out_used += exp->tok_len[i];
        }
    }
    out[out_used] = '\0';

    lyxp_expr_free(exp);
    return lydict_insert_zc(module->ctx, out);

error:
    free(out);
    lyxp_expr_free(exp);
    return NULL;
}